

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

int wallet::CalculateMaximumSignedInputSize
              (CTxOut *txout,COutPoint outpoint,SigningProvider *provider,bool can_grind_r,
              CCoinControl *coin_control)

{
  byte bVar1;
  bool bVar2;
  int64_t iVar3;
  optional<CTxIn> *in_RCX;
  byte in_DL;
  long in_RSI;
  long in_FS_OFFSET;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc;
  optional<long> weight;
  optional<CTxIn> *in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  SigningProvider *in_stack_ffffffffffffff10;
  CScript *in_stack_ffffffffffffff18;
  undefined1 *nWeight;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  CCoinControl *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  int local_94;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  if (in_RSI == 0) {
    local_94 = -1;
    goto LAB_016c0f0a;
  }
  InferDescriptor(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                     in_stack_fffffffffffffef8);
  if (bVar2) {
    std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator*
              ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    nWeight = local_78;
    std::optional<CTxIn>::optional(in_stack_fffffffffffffef8);
    MaxInputWeight((Descriptor *)CONCAT17(bVar1,in_stack_ffffffffffffff50),in_RCX,
                   in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f,
                   (bool)in_stack_ffffffffffffff3e);
    std::optional<CTxIn>::~optional(in_stack_fffffffffffffef8);
    bVar2 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_fffffffffffffef8);
    if (!bVar2) goto LAB_016c0ed6;
    std::optional<long>::operator*((optional<long> *)in_stack_fffffffffffffef8);
    iVar3 = GetVirtualTransactionSize
                      ((int64_t)nWeight,
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       in_stack_ffffffffffffff04);
    local_94 = (int)iVar3;
    bVar2 = true;
  }
  else {
LAB_016c0ed6:
    bVar2 = false;
  }
  std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
            ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (!bVar2) {
    local_94 = -1;
  }
LAB_016c0f0a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_94;
}

Assistant:

int CalculateMaximumSignedInputSize(const CTxOut& txout, const COutPoint outpoint, const SigningProvider* provider, bool can_grind_r, const CCoinControl* coin_control)
{
    if (!provider) return -1;

    if (const auto desc = InferDescriptor(txout.scriptPubKey, *provider)) {
        if (const auto weight = MaxInputWeight(*desc, {}, coin_control, true, can_grind_r)) {
            return static_cast<int>(GetVirtualTransactionSize(*weight, 0, 0));
        }
    }

    return -1;
}